

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.c
# Opt level: O0

c_int scale_data(OSQPWorkspace *work)

{
  long *in_RDI;
  c_float *pcVar1;
  c_float inf_norm_q;
  c_float c_temp;
  c_int m;
  c_int n;
  c_int i;
  c_float *in_stack_ffffffffffffffc8;
  c_float *in_stack_ffffffffffffffd0;
  c_float *in_stack_ffffffffffffffd8;
  c_float *D;
  csc *A;
  csc *P;
  
  A = *(csc **)*in_RDI;
  D = *(c_float **)(*in_RDI + 8);
  *(undefined8 *)in_RDI[0x18] = 0x3ff0000000000000;
  vec_set_scalar(*(c_float **)(in_RDI[0x18] + 8),1.0,*(c_int *)*in_RDI);
  vec_set_scalar(*(c_float **)(in_RDI[0x18] + 0x20),1.0,*(c_int *)*in_RDI);
  vec_set_scalar(*(c_float **)(in_RDI[0x18] + 0x10),1.0,*(c_int *)(*in_RDI + 8));
  vec_set_scalar(*(c_float **)(in_RDI[0x18] + 0x28),1.0,*(c_int *)(*in_RDI + 8));
  for (P = (csc *)0x0; (long)P < *(long *)(in_RDI[0x17] + 0x10); P = (csc *)((long)&P->nzmax + 1)) {
    compute_inf_norm_cols_KKT
              (P,A,D,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               (c_int)in_stack_ffffffffffffffc8);
    limit_scaling((c_float *)in_RDI[0x14],(c_int)A);
    limit_scaling((c_float *)in_RDI[0x16],(c_int)D);
    vec_ew_sqrt(in_stack_ffffffffffffffd0,(c_int)in_stack_ffffffffffffffc8);
    vec_ew_sqrt(in_stack_ffffffffffffffd0,(c_int)in_stack_ffffffffffffffc8);
    vec_ew_recipr((c_float *)in_RDI[0x14],(c_float *)in_RDI[0x14],(c_int)A);
    vec_ew_recipr((c_float *)in_RDI[0x16],(c_float *)in_RDI[0x16],(c_int)D);
    mat_premult_diag(*(csc **)(*in_RDI + 0x10),(c_float *)in_RDI[0x14]);
    mat_postmult_diag(*(csc **)(*in_RDI + 0x10),(c_float *)in_RDI[0x14]);
    mat_premult_diag(*(csc **)(*in_RDI + 0x18),(c_float *)in_RDI[0x16]);
    mat_postmult_diag(*(csc **)(*in_RDI + 0x18),(c_float *)in_RDI[0x14]);
    vec_ew_prod((c_float *)in_RDI[0x14],*(c_float **)(*in_RDI + 0x20),*(c_float **)(*in_RDI + 0x20),
                (c_int)A);
    vec_ew_prod(*(c_float **)(in_RDI[0x18] + 8),(c_float *)in_RDI[0x14],
                *(c_float **)(in_RDI[0x18] + 8),(c_int)A);
    vec_ew_prod(*(c_float **)(in_RDI[0x18] + 0x10),(c_float *)in_RDI[0x16],
                *(c_float **)(in_RDI[0x18] + 0x10),(c_int)D);
    mat_inf_norm_cols_sym_triu(*(csc **)(*in_RDI + 0x10),(c_float *)in_RDI[0x14]);
    pcVar1 = (c_float *)vec_mean((c_float *)in_RDI[0x14],(c_int)A);
    in_stack_ffffffffffffffd0 = (c_float *)vec_norm_inf(*(c_float **)(*in_RDI + 0x20),(c_int)A);
    limit_scaling((c_float *)&stack0xffffffffffffffd0,1);
    in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffd0;
    if ((double)in_stack_ffffffffffffffd0 < (double)pcVar1) {
      in_stack_ffffffffffffffc8 = pcVar1;
    }
    in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffc8;
    limit_scaling((c_float *)&stack0xffffffffffffffd8,1);
    in_stack_ffffffffffffffd8 = (c_float *)(1.0 / (double)in_stack_ffffffffffffffd8);
    mat_mult_scalar(*(csc **)(*in_RDI + 0x10),(c_float)in_stack_ffffffffffffffd8);
    vec_mult_scalar(*(c_float **)(*in_RDI + 0x20),(c_float)in_stack_ffffffffffffffd8,(c_int)A);
    *(double *)in_RDI[0x18] = (double)in_stack_ffffffffffffffd8 * *(double *)in_RDI[0x18];
  }
  *(double *)(in_RDI[0x18] + 0x18) = 1.0 / *(double *)in_RDI[0x18];
  vec_ew_recipr(*(c_float **)(in_RDI[0x18] + 8),*(c_float **)(in_RDI[0x18] + 0x20),*(c_int *)*in_RDI
               );
  vec_ew_recipr(*(c_float **)(in_RDI[0x18] + 0x10),*(c_float **)(in_RDI[0x18] + 0x28),
                *(c_int *)(*in_RDI + 8));
  vec_ew_prod(*(c_float **)(in_RDI[0x18] + 0x10),*(c_float **)(*in_RDI + 0x28),
              *(c_float **)(*in_RDI + 0x28),*(c_int *)(*in_RDI + 8));
  vec_ew_prod(*(c_float **)(in_RDI[0x18] + 0x10),*(c_float **)(*in_RDI + 0x30),
              *(c_float **)(*in_RDI + 0x30),*(c_int *)(*in_RDI + 8));
  return 0;
}

Assistant:

c_int scale_data(OSQPWorkspace *work) {
  // Scale KKT matrix
  //
  //    [ P   A']
  //    [ A   0 ]
  //
  // with diagonal matrix
  //
  //  S = [ D    ]
  //      [    E ]
  //

  c_int   i;          // Iterations index
  c_int   n, m;       // Number of constraints and variables
  c_float c_temp;     // Cost function scaling
  c_float inf_norm_q; // Infinity norm of q

  n = work->data->n;
  m = work->data->m;

  // Initialize scaling to 1
  work->scaling->c = 1.0;
  vec_set_scalar(work->scaling->D,    1., work->data->n);
  vec_set_scalar(work->scaling->Dinv, 1., work->data->n);
  vec_set_scalar(work->scaling->E,    1., work->data->m);
  vec_set_scalar(work->scaling->Einv, 1., work->data->m);


  for (i = 0; i < work->settings->scaling; i++) {
    //
    // First Ruiz step
    //

    // Compute norm of KKT columns
    compute_inf_norm_cols_KKT(work->data->P, work->data->A,
                              work->D_temp, work->D_temp_A,
                              work->E_temp, n);

    // Set to 1 values with 0 norms (avoid crazy scaling)
    limit_scaling(work->D_temp, n);
    limit_scaling(work->E_temp, m);

    // Take square root of norms
    vec_ew_sqrt(work->D_temp, n);
    vec_ew_sqrt(work->E_temp, m);

    // Divide scalings D and E by themselves
    vec_ew_recipr(work->D_temp, work->D_temp, n);
    vec_ew_recipr(work->E_temp, work->E_temp, m);

    // Equilibrate matrices P and A and vector q
    // P <- DPD
    mat_premult_diag(work->data->P, work->D_temp);
    mat_postmult_diag(work->data->P, work->D_temp);

    // A <- EAD
    mat_premult_diag(work->data->A, work->E_temp);
    mat_postmult_diag(work->data->A, work->D_temp);

    // q <- Dq
    vec_ew_prod(work->D_temp,     work->data->q, work->data->q,    n);

    // Update equilibration matrices D and E
    vec_ew_prod(work->scaling->D, work->D_temp,  work->scaling->D, n);
    vec_ew_prod(work->scaling->E, work->E_temp,  work->scaling->E, m);

    //
    // Cost normalization step
    //

    // Compute avg norm of cols of P
    mat_inf_norm_cols_sym_triu(work->data->P, work->D_temp);
    c_temp = vec_mean(work->D_temp, n);

    // Compute inf norm of q
    inf_norm_q = vec_norm_inf(work->data->q, n);

    // If norm_q == 0, set it to 1 (ignore it in the scaling)
    // NB: Using the same function as with vectors here
    limit_scaling(&inf_norm_q, 1);

    // Compute max between avg norm of cols of P and inf norm of q
    c_temp = c_max(c_temp, inf_norm_q);

    // Limit scaling (use same function as with vectors)
    limit_scaling(&c_temp, 1);

    // Invert scaling c = 1 / cost_measure
    c_temp = 1. / c_temp;

    // Scale P
    mat_mult_scalar(work->data->P, c_temp);

    // Scale q
    vec_mult_scalar(work->data->q, c_temp, n);

    // Update cost scaling
    work->scaling->c *= c_temp;
  }


  // Store cinv, Dinv, Einv
  work->scaling->cinv = 1. / work->scaling->c;
  vec_ew_recipr(work->scaling->D, work->scaling->Dinv, work->data->n);
  vec_ew_recipr(work->scaling->E, work->scaling->Einv, work->data->m);


  // Scale problem vectors l, u
  vec_ew_prod(work->scaling->E, work->data->l, work->data->l, work->data->m);
  vec_ew_prod(work->scaling->E, work->data->u, work->data->u, work->data->m);

  return 0;
}